

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Connection::handlePING(QHttp2Connection *this)

{
  bool bVar1;
  __optional_ne_t<QByteArrayView,_QByteArray> _Var2;
  quint32 qVar3;
  Int IVar4;
  Frame *this_00;
  QIODevice *pQVar5;
  size_t __n;
  void *__buf;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView pingSignature;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff48;
  PingState _t1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff50;
  Frame *in_stack_ffffffffffffff58;
  QByteArrayView *in_stack_ffffffffffffff60;
  QByteArrayView *pQVar6;
  Http2Error in_stack_ffffffffffffff7c;
  QHttp2Connection *in_stack_ffffffffffffff80;
  char local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  QFlagsStorageHelper<Http2::FrameFlag,_4> local_30;
  QFlagsStorageHelper<Http2::FrameFlag,_4> local_2c;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  qVar3 = Http2::Frame::streamID((Frame *)0x2b8857);
  if (qVar3 == 0) {
    local_30.super_QFlagsStorage<Http2::FrameFlag>.i =
         (QFlagsStorage<Http2::FrameFlag>)Http2::Frame::flags((Frame *)in_stack_ffffffffffffff50);
    local_2c.super_QFlagsStorage<Http2::FrameFlag>.i =
         (QFlagsStorage<Http2::FrameFlag>)
         QFlags<Http2::FrameFlag>::operator&
                   ((QFlags<Http2::FrameFlag> *)in_stack_ffffffffffffff50,
                    (FrameFlag)((ulong)in_stack_ffffffffffffff48 >> 0x38));
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    if (IVar4 == 0) {
      pingFrameRecived((QHttp2Connection *)0x2b8aa2,
                       (PingState)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      QFlags<Http2::FrameFlag>::QFlags
                ((QFlags<Http2::FrameFlag> *)in_stack_ffffffffffffff50,
                 (FrameFlag)((ulong)(in_RDI + 0x25) >> 0x38));
      __n = 0;
      Http2::FrameWriter::start
                ((FrameWriter *)in_stack_ffffffffffffff60,
                 (FrameType)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                 (QFlagsStorageHelper<Http2::FrameFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0),
                 (quint32)in_stack_ffffffffffffff58);
      this_00 = (Frame *)Http2::Frame::dataBegin(in_stack_ffffffffffffff58);
      Http2::Frame::dataBegin(this_00);
      Http2::FrameWriter::append
                ((FrameWriter *)in_RDI,(uchar *)in_stack_ffffffffffffff60,(uchar *)this_00);
      pQVar6 = in_RDI + 0x25;
      pQVar5 = getSocket((QHttp2Connection *)0x2b8b37);
      Http2::FrameWriter::write((FrameWriter *)pQVar6,(int)pQVar5,__buf,__n);
    }
    else {
      local_40 = 0xaaaaaaaaaaaaaaaa;
      local_38 = 0xaaaaaaaaaaaaaaaa;
      Http2::Frame::dataBegin(in_stack_ffffffffffffff58);
      QByteArrayView::QByteArrayView<char,_true>
                (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                 (qsizetype)in_stack_ffffffffffffff50);
      bVar1 = std::optional<QByteArray>::has_value((optional<QByteArray> *)0x2b890d);
      if (bVar1) {
        _Var2 = std::operator!=(in_RDI,(optional<QByteArray> *)in_stack_ffffffffffffff60);
        _t1 = (PingState)((ulong)in_stack_ffffffffffffff48 >> 0x20);
        if (_Var2) {
          pingFrameRecived((QHttp2Connection *)0x2b89e2,_t1);
          local_28 = 0xaaaaaaaaaaaaaaaa;
          local_20 = 0xaaaaaaaaaaaaaaaa;
          qHttp2ConnectionLog();
          anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
            anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x2b8a35);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58
                       ,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                       (char *)in_stack_ffffffffffffff48,(char *)0x2b8a4b);
            QMessageLogger::warning
                      (&stack0xffffffffffffff80,"[%p] PING signature does not match the last PING.",
                       in_RDI);
            local_20 = local_20 & 0xffffffffffffff00;
          }
        }
        else {
          pingFrameRecived((QHttp2Connection *)0x2b8a7e,_t1);
        }
      }
      else {
        pingFrameRecived((QHttp2Connection *)0x2b8924,
                         (PingState)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        qHttp2ConnectionLog();
        anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
          anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x2b8977);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                     (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (char *)in_stack_ffffffffffffff48,(char *)0x2b898d);
          QMessageLogger::warning
                    (local_60,"[%p] PING with ACK received but no PING was sent.",in_RDI);
          local_10 = local_10 & 0xffffffffffffff00;
        }
      }
      std::optional<QByteArray>::reset((optional<QByteArray> *)0x2b8a91);
    }
  }
  else {
    connectionError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(char *)pQVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::handlePING()
{
    Q_ASSERT(inboundFrame.type() == FrameType::PING);

    // RFC 9113, 6.7: PING frames are not associated with any individual stream. If a PING frame is
    // received with a Stream Identifier field value other than 0x00, the recipient MUST respond
    // with a connection error
    if (inboundFrame.streamID() != connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "PING on invalid stream");

    // Receipt of a PING frame with a length field value other than 8 MUST be treated
    // as a connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.payloadSize() == 8);

    if (inboundFrame.flags() & FrameFlag::ACK) {
        QByteArrayView pingSignature(reinterpret_cast<const char *>(inboundFrame.dataBegin()), 8);
        if (!m_lastPingSignature.has_value()) {
            emit pingFrameRecived(PingState::PongNoPingSent);
            qCWarning(qHttp2ConnectionLog, "[%p] PING with ACK received but no PING was sent.", this);
        } else if (pingSignature != m_lastPingSignature) {
            emit pingFrameRecived(PingState::PongSignatureChanged);
            qCWarning(qHttp2ConnectionLog, "[%p] PING signature does not match the last PING.", this);
        } else {
            emit pingFrameRecived(PingState::PongSignatureIdentical);
        }
        m_lastPingSignature.reset();
        return;
    } else {
        emit pingFrameRecived(PingState::Ping);

    }


    frameWriter.start(FrameType::PING, FrameFlag::ACK, connectionStreamID);
    frameWriter.append(inboundFrame.dataBegin(), inboundFrame.dataBegin() + 8);
    frameWriter.write(*getSocket());
}